

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.h
# Opt level: O1

t_object * __thiscall
xemmai::t_engine::f_allocate_for_type<xemmai::t_derived<xemmai::t_type_of<std::filesystem::perms>>>
          (t_engine *this,size_t a_fields)

{
  ulong a_size;
  long *plVar1;
  t_object *ptVar2;
  
  a_size = a_fields * 0x28 + 0x1c0;
  if (a_size < 0x81) {
    plVar1 = (long *)__tls_get_addr(&PTR_0011ede0);
    ptVar2 = (t_object *)*plVar1;
    if (ptVar2 == (t_object *)0x0) {
      ptVar2 = t_heap<xemmai::t_object>::t_of<0UL,_65536UL>::f_allocate
                         ((t_of<0UL,_65536UL> *)(this + 0x90),
                          (t_heap<xemmai::t_object> *)(this + 0x30));
    }
    *plVar1 = (long)ptVar2->v_next;
  }
  else {
    ptVar2 = t_heap<xemmai::t_object>::f_allocate_medium
                       ((t_heap<xemmai::t_object> *)(this + 0x30),a_size);
  }
  ptVar2->v_next = (t_object *)0x0;
  return ptVar2;
}

Assistant:

t_object* f_allocate_for_type(size_t a_fields)
	{
		return f_allocate(t_object::f_align_for_fields(sizeof(T)) + (sizeof(std::pair<t_slot, t_svalue>) + sizeof(std::pair<t_object*, size_t>)) * a_fields);
	}